

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

arg_hashtable_t * arg_hashtable_create(uint minsize,_func_uint_void_ptr *hashfn,arg_comparefn *eqfn)

{
  uint *puVar1;
  arg_hashtable_t *paVar2;
  arg_hashtable_entry **ppaVar3;
  uint uVar4;
  long lVar5;
  double dVar6;
  
  if (minsize < 0x40000001) {
    puVar1 = primes;
    lVar5 = 0;
    do {
      uVar4 = *puVar1;
      if (minsize < uVar4) goto LAB_00120b0d;
      lVar5 = lVar5 + 1;
      puVar1 = puVar1 + 1;
    } while (lVar5 != 0x1a);
    uVar4 = 0x35;
    lVar5 = 0x1a;
LAB_00120b0d:
    paVar2 = (arg_hashtable_t *)malloc(0x30);
    if (paVar2 == (arg_hashtable_t *)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    ppaVar3 = (arg_hashtable_entry **)calloc(1,(ulong)uVar4 * 8);
    if (ppaVar3 == (arg_hashtable_entry **)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    paVar2->table = ppaVar3;
    paVar2->tablelength = uVar4;
    paVar2->primeindex = (uint)lVar5;
    paVar2->entrycount = 0;
    paVar2->hashfn = hashfn;
    paVar2->eqfn = eqfn;
    dVar6 = ceil((double)uVar4 * 0.6499999761581421);
    paVar2->loadlimit = (uint)(long)dVar6;
  }
  else {
    paVar2 = (arg_hashtable_t *)0x0;
  }
  return paVar2;
}

Assistant:

arg_hashtable_t* arg_hashtable_create(unsigned int minsize, unsigned int (*hashfn)(const void*), int (*eqfn)(const void*, const void*)) {
    arg_hashtable_t* h;
    unsigned int pindex;
    unsigned int size = primes[0];

    /* Check requested hash table isn't too large */
    if (minsize > (1u << 30))
        return NULL;

    /*
     * Enforce size as prime. The reason is to avoid clustering of values
     * into a small number of buckets (yes, distribution). A more even
     *  distributed hash table will perform more consistently.
     */
    for (pindex = 0; pindex < prime_table_length; pindex++) {
        if (primes[pindex] > minsize) {
            size = primes[pindex];
            break;
        }
    }

    h = (arg_hashtable_t*)xmalloc(sizeof(arg_hashtable_t));
    h->table = (struct arg_hashtable_entry**)xmalloc(sizeof(struct arg_hashtable_entry*) * size);
    memset(h->table, 0, size * sizeof(struct arg_hashtable_entry*));
    h->tablelength = size;
    h->primeindex = pindex;
    h->entrycount = 0;
    h->hashfn = hashfn;
    h->eqfn = eqfn;
    h->loadlimit = (unsigned int)ceil(size * (double)max_load_factor);
    return h;
}